

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O2

void call_http_client_handler(connection *conn)

{
  uint *puVar1;
  ns_connection *pnVar2;
  int iVar3;
  
  pnVar2 = conn->ns_conn;
  if (conn->cl == 0) {
    (conn->mg_conn).content_len = (pnVar2->recv_iobuf).len;
  }
  (conn->mg_conn).content = (pnVar2->recv_iobuf).buf;
  iVar3 = call_user(conn,MG_REPLY);
  pnVar2 = conn->ns_conn;
  if (iVar3 == 0) {
    puVar1 = &pnVar2->flags;
    *(byte *)puVar1 = (byte)*puVar1 | 0x10;
  }
  iobuf_remove(&pnVar2->recv_iobuf,(conn->mg_conn).content_len);
  (conn->mg_conn).status_code = 0;
  conn->num_bytes_recv = 0;
  conn->cl = 0;
  conn->request_len = 0;
  free(conn->request);
  conn->request = (char *)0x0;
  return;
}

Assistant:

static void call_http_client_handler(struct connection *conn) {
  //conn->mg_conn.status_code = code;
  // For responses without Content-Lengh, use the whole buffer
  if (conn->cl == 0) {
    conn->mg_conn.content_len = conn->ns_conn->recv_iobuf.len;
  }
  conn->mg_conn.content = conn->ns_conn->recv_iobuf.buf;
  if (call_user(conn, MG_REPLY) == MG_FALSE) {
    conn->ns_conn->flags |= NSF_CLOSE_IMMEDIATELY;
  }
  iobuf_remove(&conn->ns_conn->recv_iobuf, conn->mg_conn.content_len);
  conn->mg_conn.status_code = 0;
  conn->cl = conn->num_bytes_recv = conn->request_len = 0;
  free(conn->request);
  conn->request = NULL;
}